

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSIUnit,_2UL>::Construct
                   (DB *db,LIST *params)

{
  IfcSIUnit *in;
  
  in = (IfcSIUnit *)operator_new(0xa8);
  *(undefined8 *)&in->field_0x98 = 0;
  *(char **)&in->field_0xa0 = "IfcSIUnit";
  (in->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
  aux_is_derived.super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)
   &(in->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
    field_0x10 = 0;
  *(undefined1 **)
   &(in->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
    field_0x18 = &(in->super_IfcNamedUnit).field_0x28;
  *(undefined8 *)
   &(in->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
    field_0x20 = 0;
  (in->super_IfcNamedUnit).field_0x28 = 0;
  *(undefined8 *)&(in->super_IfcNamedUnit).field_0x40 = 0;
  (in->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcSIUnit_008f7138;
  *(undefined ***)&in->field_0x90 = &PTR__IfcSIUnit_008f7188;
  *(undefined ***)&(in->super_IfcNamedUnit).field_0x38 = &PTR__IfcSIUnit_008f7160;
  *(undefined1 **)&(in->super_IfcNamedUnit).field_0x48 = &in->field_0x58;
  *(undefined8 *)&in->field_0x50 = 0;
  in->field_0x58 = 0;
  in->field_0x68 = 0;
  (in->Name)._M_dataplus._M_p = (pointer)&(in->Name).field_2;
  (in->Name)._M_string_length = 0;
  (in->Name).field_2._M_local_buf[0] = '\0';
  GenericFill<Assimp::IFC::Schema_2x3::IfcSIUnit>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcNamedUnit).
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>._vptr_ObjectHelper +
         (long)(in->super_IfcNamedUnit).
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>._vptr_ObjectHelper[-3]
         );
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }